

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManCutRange(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  
  Aig_ManIncrementTravId(p);
  iVar8 = vLower->nSize;
  if (0 < (long)iVar8) {
    ppvVar6 = vLower->pArray;
    iVar1 = p->nTravIds;
    lVar7 = 0;
    do {
      *(int *)((long)ppvVar6[lVar7] + 0x20) = iVar1;
      lVar7 = lVar7 + 1;
    } while (iVar8 != lVar7);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  if (0 < vUpper->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = vUpper->pArray[lVar7];
      if (*(int *)((long)pvVar4 + 0x20) != p->nTravIds) {
        uVar2 = pVVar5->nSize;
        uVar3 = pVVar5->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar3 * 2;
            if (iVar8 <= (int)uVar3) goto LAB_008339aa;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar3 << 4);
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar8;
        }
LAB_008339aa:
        pVVar5->nSize = uVar2 + 1;
        pVVar5->pArray[(int)uVar2] = pvVar4;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vUpper->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Llb_ManCutRange( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vRange;
    Aig_Obj_t * pObj;
    int i;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // collect the upper ones that are not marked
    vRange = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vRange, pObj );
    return vRange;
}